

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O1

int main(void)

{
  bool bVar1;
  time_t tVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running tests... (seed = ",0x19);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n\n",3);
  iVar5 = 10;
  do {
    bVar1 = test_random_instance();
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n",0x2a);
      iVar4 = iVar4 + 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"test_random_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n",0x2a);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  bVar1 = test_simple_instance();
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[32m PASSED!\x1b[0m\n",0x2a);
    iVar4 = iVar4 + 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_simple_instance\x1b[1m\x1b[31m FAILED!\x1b[0m\n",0x2a);
  }
  bVar1 = test_simple_instance2();
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[32m PASSED!\x1b[0m\n",0x2b);
    iVar4 = iVar4 + 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test_simple_instance2\x1b[1m\x1b[31m FAILED!\x1b[0m\n",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nDone! Passed ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," tests.\n",8);
  return 0;
}

Assistant:

int main() {
    unsigned int seed = (unsigned int)time(0);	
    srand(seed);
    
	std::cout << "Running tests... (seed = " << seed << ")\n\n";

	int passed = 0;
	int num_tests = 0;

    for(int i = 0; i < 10; ++i) {
	    TEST(test_random_instance);
    }

	TEST(test_simple_instance);

    TEST(test_simple_instance2);

	std::cout << "\nDone! Passed " << passed << "/" << num_tests << " tests.\n";
}